

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::SeekToFirst(MergingIterator *this)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < this->n_; lVar2 = lVar2 + 1) {
    IteratorWrapper::SeekToFirst((IteratorWrapper *)((long)&this->children_->iter_ + lVar1));
    lVar1 = lVar1 + 0x20;
  }
  FindSmallest(this);
  this->direction_ = kForward;
  return;
}

Assistant:

void SeekToFirst() override {
    for (int i = 0; i < n_; i++) {
      children_[i].SeekToFirst();
    }
    FindSmallest();
    direction_ = kForward;
  }